

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O1

void perf_get_interest_points
               (_func_void_fasthessian_ptr_vector<interest_point,_std::allocator<interest_point>_>_ptr
                *function,fasthessian *fh,benchmark_data *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  pointer piVar5;
  pointer piVar6;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  vector<double,_std::allocator<double>_> cycleslist;
  double cycles;
  vector<interest_point,_std::allocator<interest_point>_> dummy_interest_points_1;
  vector<interest_point,_std::allocator<interest_point>_> local_88;
  double local_70;
  benchmark_data *local_68;
  double local_60;
  vector<interest_point,_std::allocator<interest_point>_> local_58;
  double local_40;
  double local_38;
  
  local_70 = 0.0;
  lVar10 = 100;
  dVar12 = 1.0;
  local_68 = data;
  do {
    lVar10 = (long)(dVar12 * (double)lVar10);
    local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              (&local_88,local_68->num_interest_points * lVar10);
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    for (lVar8 = lVar10; lVar8 != 0; lVar8 = lVar8 + -1) {
      (*function)(fh,&local_88);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    if (local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    auVar11 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (uVar2 & 0xffffffff) +
                                 (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) -
                                 (uVar1 & 0xffffffff)) + (uVar2 & 0xffffffff00000000));
    dVar12 = auVar11._0_8_;
    local_70 = dVar12;
    if (local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    dVar12 = 100000000.0 / dVar12;
  } while (2.0 < dVar12);
  local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (double)lVar10;
  dVar12 = 0.0;
  lVar8 = 0;
  do {
    local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = dVar12;
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              (&local_58,local_68->num_interest_points * lVar10);
    cpuid_basic_info(0);
    uVar3 = rdtsc();
    local_60 = (double)CONCAT44(local_60._4_4_,(int)uVar3);
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (*function)(fh,&local_58);
    }
    uVar1 = rdtsc();
    cpuid_basic_info(0);
    if (local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    auVar11 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (uVar1 & 0xffffffff) +
                                 (((ulong)(uint)-(int)((ulong)uVar3 >> 0x20) << 0x20) -
                                 ((ulong)local_60 & 0xffffffff)) + (uVar1 & 0xffffffff00000000));
    local_70 = auVar11._0_8_ / local_40;
    local_60 = local_70;
    if (local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_70);
    }
    else {
      *(double *)
       local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
       super__Vector_impl_data._M_finish = local_70;
      local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((long)local_88.
                           super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 8);
    }
    if (local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    piVar6 = local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar5 = local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar12 = local_38 + local_60;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  dVar12 = dVar12 / 10.0;
  lVar10 = local_68->num_flops;
  local_70 = dVar12;
  if (local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_88.
                                  super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_88.
                                  super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar5,piVar6);
  }
  auVar13._0_8_ = ((double)lVar10 * 100.0) / dVar12;
  auVar13._8_8_ = 0;
  auVar16._8_8_ = 0x3fdfffffffffffff;
  auVar16._0_8_ = 0x3fdfffffffffffff;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar11 = vpternlogq_avx512vl(auVar16,auVar13,auVar4,0xf8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar13._0_8_ + auVar11._0_8_;
  auVar4 = vroundsd_avx(auVar14,auVar14,0xb);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_70;
  auVar11 = vmovhps_avx(auVar15,*(double *)
                                 local_88.
                                 super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
  auVar11 = vcvttpd2uqq_avx512vl(auVar11);
  local_68->avg_cycles = auVar11._0_8_;
  local_68->min_cycles = auVar11._8_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(ulong *)(local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].descriptor + 0x3e);
  uVar7 = vcvttsd2usi_avx512f(auVar11);
  local_68->max_cycles = uVar7;
  local_68->flops_per_cycle = auVar4._0_8_ / 100.0;
  operator_delete(local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_88.super__Vector_base<interest_point,_std::allocator<interest_point>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void perf_get_interest_points(void (*function)(struct fasthessian *, std::vector<struct interest_point> *),
                              struct fasthessian *fh, struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);
        dummy_interest_points.clear();

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();

        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);

        dummy_interest_points.clear();

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();
    data.max_cycles = (uint64_t)cycleslist.back();
    data.flops_per_cycle = flops_per_cycle;
}